

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  string origStr;
  string local_50 [8];
  ulong local_48;
  
  lVar1 = std::__cxx11::string::find((string *)str,(ulong)replaceThis);
  if (lVar1 != -1) {
    std::__cxx11::string::string(local_50,(string *)str);
    str->_M_string_length = 0;
    *(str->_M_dataplus)._M_p = '\0';
    std::__cxx11::string::reserve((ulong)str);
    uVar3 = 0;
    lVar2 = lVar1;
    do {
      std::__cxx11::string::append((string *)str,(ulong)local_50,uVar3);
      std::__cxx11::string::append((string *)str);
      uVar3 = lVar2 + replaceThis->_M_string_length;
      if (local_48 <= uVar3) break;
      lVar2 = std::__cxx11::string::find(local_50,(ulong)replaceThis);
    } while (lVar2 != -1);
    if (uVar3 < local_48) {
      std::__cxx11::string::append((string *)str,(ulong)local_50,uVar3);
    }
    std::__cxx11::string::~string(local_50);
  }
  return lVar1 != -1;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        std::size_t i = str.find( replaceThis );
        if (i == std::string::npos) {
            return false;
        }
        std::size_t copyBegin = 0;
        std::string origStr = CATCH_MOVE(str);
        str.clear();
        // There is at least one replacement, so reserve with the best guess
        // we can make without actually counting the number of occurences.
        str.reserve(origStr.size() - replaceThis.size() + withThis.size());
        do {
            str.append(origStr, copyBegin, i-copyBegin );
            str += withThis;
            copyBegin = i + replaceThis.size();
            if( copyBegin < origStr.size() )
                i = origStr.find( replaceThis, copyBegin );
            else
                i = std::string::npos;
        } while( i != std::string::npos );
        if ( copyBegin < origStr.size() ) {
            str.append(origStr, copyBegin, origStr.size() );
        }
        return true;
    }